

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgt_save_glcolorbuffer_bmp(GLenum buffer,GLenum format,char *filename)

{
  bool bVar1;
  djg_texture *texture;
  
  texture = (djg_texture *)calloc(1,0x20);
  bVar1 = djgt_push_glcolorbuffer(texture,buffer,format,0x1401,true);
  if (bVar1) {
    bVar1 = djgt_save_bmp(texture,filename);
  }
  else {
    bVar1 = false;
  }
  djgt_release(texture);
  return bVar1;
}

Assistant:

bool djgt_save_bmp(const djg_texture *texture, const char *filename)
{
    const djg_texture* it = texture->next;
    int cnt = djgt__count(texture);
    char buf[1024];

    if (cnt == 1) {
        sprintf(buf, "%s.bmp", filename);

        return stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels);
    } else {
        int i = 1;

        while (it) {
            sprintf(buf, "%s_layer%03i.bmp", filename, i);

            ++i;
            if (!stbi_write_bmp(buf, it->x, it->y, it->comp, it->texels))
                return false;
        }
    }

    return true;
}